

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Field<char[13],_pstack::DumpCFAInsns>,_const_pstack::Dwarf::CFI_*>
                            *o)

{
  DumpCFAInsns *pDVar1;
  int iVar2;
  ostream *os_00;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  DWARFReader local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char local_31;
  Off OVar3;
  
  local_58._M_dataplus._M_p = *o->object->k;
  local_80.end = (Off)&local_31;
  local_31 = '\0';
  local_80.off = (Off)&local_58;
  os_00 = operator<<(os,(JSON<const_char_*,_char> *)&local_80);
  std::__ostream_insert<char,std::char_traits<char>>(os_00,":",1);
  pDVar1 = o->object->v;
  local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((*o->context)->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = ((*o->context)->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_80.off = pDVar1->start;
  OVar3 = pDVar1->end;
  if (OVar3 == 0xffffffffffffffff) {
    iVar2 = (*(local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Reader[8])
                      (local_80.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    OVar3 = CONCAT44(extraout_var,iVar2);
  }
  local_80.addrLen = 8;
  local_80.end = OVar3;
  std::__ostream_insert<char,std::char_traits<char>>(os_00,"[ ",2);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  while (local_80.off != local_80.end) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os_00,local_58._M_dataplus._M_p,local_58._M_string_length);
    dumpCFAInsn(os_00,&local_80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_58,0,local_58._M_string_length,",\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os_00,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return os_00;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}